

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_scan_tag_handle
              (yaml_parser_t *parser,int directive,yaml_mark_t start_mark,yaml_char_t **handle)

{
  size_t *psVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  size_t sVar5;
  byte bVar6;
  char *pcVar7;
  byte *local_50;
  byte *local_48;
  byte *pbStack_40;
  yaml_mark_t *local_38;
  
  local_48 = (byte *)0x0;
  pbStack_40 = (byte *)0x0;
  pbVar4 = (byte *)yaml_malloc(0x10);
  local_50 = pbVar4;
  if (pbVar4 == (byte *)0x0) {
LAB_00113d34:
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    local_48 = pbVar4 + 0x10;
    pbVar4[0] = 0;
    pbVar4[1] = 0;
    pbVar4[2] = 0;
    pbVar4[3] = 0;
    pbVar4[4] = 0;
    pbVar4[5] = 0;
    pbVar4[6] = 0;
    pbVar4[7] = 0;
    pbVar4[8] = 0;
    pbVar4[9] = 0;
    pbVar4[10] = 0;
    pbVar4[0xb] = 0;
    pbVar4[0xc] = 0;
    pbVar4[0xd] = 0;
    pbVar4[0xe] = 0;
    pbVar4[0xf] = 0;
    pbStack_40 = pbVar4;
    if ((parser->unread != 0) || (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 != 0)) {
      pbVar2 = (parser->buffer).pointer;
      if (*pbVar2 == 0x21) {
        (parser->buffer).pointer = pbVar2 + 1;
        pbStack_40 = pbVar4 + 1;
        *pbVar4 = *pbVar2;
        (parser->mark).index = (parser->mark).index + 1;
        psVar1 = &(parser->mark).column;
        *psVar1 = *psVar1 + 1;
        psVar1 = &parser->unread;
        *psVar1 = *psVar1 - 1;
        if ((*psVar1 != 0) || (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 != 0)) {
          local_38 = &parser->mark;
          do {
            pbVar4 = (parser->buffer).pointer;
            bVar6 = *pbVar4;
            if ((((9 < (byte)(bVar6 - 0x30)) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf))) &&
                (bVar6 != 0x2d)) && (bVar6 != 0x5f)) {
              if (bVar6 == 0x21) {
                if (pbStack_40 + 5 < local_48) {
LAB_00113d04:
                  (parser->buffer).pointer = pbVar4 + 1;
                  *pbStack_40 = *pbVar4;
                }
                else {
                  iVar3 = yaml_string_extend(&local_50,&pbStack_40,&local_48);
                  if (iVar3 == 0) goto LAB_00113d34;
                  pbVar4 = (parser->buffer).pointer;
                  bVar6 = *pbVar4;
                  if (-1 < (char)bVar6) goto LAB_00113d04;
                  if ((bVar6 & 0xe0) == 0xc0) {
LAB_00113ce0:
                    (parser->buffer).pointer = pbVar4 + 1;
                    *pbStack_40 = *pbVar4;
                    pbVar4 = (parser->buffer).pointer;
                    pbStack_40 = pbStack_40 + 1;
                    goto LAB_00113d04;
                  }
                  if ((bVar6 & 0xf0) == 0xe0) {
LAB_00113cbc:
                    (parser->buffer).pointer = pbVar4 + 1;
                    *pbStack_40 = *pbVar4;
                    pbVar4 = (parser->buffer).pointer;
                    pbStack_40 = pbStack_40 + 1;
                    goto LAB_00113ce0;
                  }
                  if ((bVar6 & 0xf8) == 0xf0) {
                    (parser->buffer).pointer = pbVar4 + 1;
                    *pbStack_40 = *pbVar4;
                    pbVar4 = (parser->buffer).pointer;
                    pbStack_40 = pbStack_40 + 1;
                    goto LAB_00113cbc;
                  }
                }
                (parser->mark).index = (parser->mark).index + 1;
                psVar1 = &(parser->mark).column;
                *psVar1 = *psVar1 + 1;
                parser->unread = parser->unread - 1;
LAB_00113dae:
                *handle = local_50;
                return 1;
              }
              if ((directive == 0) || ((*local_50 == 0x21 && (local_50[1] == 0))))
              goto LAB_00113dae;
              parser->error = YAML_SCANNER_ERROR;
              parser->context = "while parsing a tag directive";
              (parser->context_mark).index = start_mark.index;
              (parser->context_mark).line = start_mark.line;
              (parser->context_mark).column = start_mark.column;
              parser->problem = "did not find expected \'!\'";
              sVar5 = local_38->line;
              (parser->problem_mark).index = local_38->index;
              (parser->problem_mark).line = sVar5;
              sVar5 = local_38->column;
              goto LAB_00113c1f;
            }
            if (local_48 <= pbStack_40 + 5) {
              iVar3 = yaml_string_extend(&local_50,&pbStack_40,&local_48);
              if (iVar3 == 0) goto LAB_00113d34;
              pbVar4 = (parser->buffer).pointer;
              bVar6 = *pbVar4;
            }
            if ((char)bVar6 < '\0') {
              if ((bVar6 & 0xe0) == 0xc0) {
LAB_00113b5f:
                (parser->buffer).pointer = pbVar4 + 1;
                *pbStack_40 = *pbVar4;
                pbVar4 = (parser->buffer).pointer;
                pbStack_40 = pbStack_40 + 1;
                goto LAB_00113b83;
              }
              if ((bVar6 & 0xf0) == 0xe0) {
LAB_00113b3b:
                (parser->buffer).pointer = pbVar4 + 1;
                *pbStack_40 = *pbVar4;
                pbVar4 = (parser->buffer).pointer;
                pbStack_40 = pbStack_40 + 1;
                goto LAB_00113b5f;
              }
              if ((bVar6 & 0xf8) == 0xf0) {
                (parser->buffer).pointer = pbVar4 + 1;
                *pbStack_40 = *pbVar4;
                pbVar4 = (parser->buffer).pointer;
                pbStack_40 = pbStack_40 + 1;
                goto LAB_00113b3b;
              }
            }
            else {
LAB_00113b83:
              (parser->buffer).pointer = pbVar4 + 1;
              *pbStack_40 = *pbVar4;
              pbStack_40 = pbStack_40 + 1;
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            psVar1 = &parser->unread;
            *psVar1 = *psVar1 - 1;
          } while ((*psVar1 != 0) || (iVar3 = yaml_parser_update_buffer(parser,1), iVar3 != 0));
        }
      }
      else {
        pcVar7 = "while scanning a tag directive";
        if (directive == 0) {
          pcVar7 = "while scanning a tag";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar7;
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        parser->problem = "did not find expected \'!\'";
        sVar5 = (parser->mark).line;
        (parser->problem_mark).index = (parser->mark).index;
        (parser->problem_mark).line = sVar5;
        sVar5 = (parser->mark).column;
LAB_00113c1f:
        (parser->problem_mark).column = sVar5;
      }
    }
  }
  yaml_free(local_50);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_handle(yaml_parser_t *parser, int directive,
        yaml_mark_t start_mark, yaml_char_t **handle)
{
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Check the initial '!' character. */

    if (!CACHE(parser, 1)) goto error;

    if (!CHECK(parser->buffer, '!')) {
        yaml_parser_set_scanner_error(parser, directive ?
                "while scanning a tag directive" : "while scanning a tag",
                start_mark, "did not find expected '!'");
        goto error;
    }

    /* Copy the '!' character. */

    if (!READ(parser, string)) goto error;

    /* Copy all subsequent alphabetical and numerical characters. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_ALPHA(parser->buffer))
    {
        if (!READ(parser, string)) goto error;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the trailing character is '!' and copy it. */

    if (CHECK(parser->buffer, '!'))
    {
        if (!READ(parser, string)) goto error;
    }
    else
    {
        /*
         * It's either the '!' tag or not really a tag handle.  If it's a %TAG
         * directive, it's an error.  If it's a tag token, it must be a part of
         * URI.
         */

        if (directive && !(string.start[0] == '!' && string.start[1] == '\0')) {
            yaml_parser_set_scanner_error(parser, "while parsing a tag directive",
                    start_mark, "did not find expected '!'");
            goto error;
        }
    }

    *handle = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}